

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O0

size_t __thiscall Lodtalk::MethodAssembler::Assembler::computeInstructionsSize(Assembler *this)

{
  vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
  *pvVar1;
  bool bVar2;
  size_t sVar3;
  reference ppIVar4;
  InstructionNode **instr_2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
  *__range3_1;
  InstructionNode **instr_1;
  iterator __end3;
  iterator __begin3;
  vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
  *__range3;
  size_t currentSize;
  size_t oldSize;
  InstructionNode **instr;
  iterator __end2;
  iterator __begin2;
  vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
  *__range2;
  size_t maxSize;
  Assembler *this_local;
  
  __range2 = (vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
              *)0x0;
  __end2 = std::
           vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
           ::begin(&this->instructionStream);
  instr = (InstructionNode **)
          std::
          vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
          ::end(&this->instructionStream);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Lodtalk::MethodAssembler::InstructionNode_**,_std::vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>_>
                                *)&instr);
    if (!bVar2) break;
    ppIVar4 = __gnu_cxx::
              __normal_iterator<Lodtalk::MethodAssembler::InstructionNode_**,_std::vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>_>
              ::operator*(&__end2);
    sVar3 = InstructionNode::computeMaxSizeForPosition(*ppIVar4,(size_t)__range2);
    __range2 = (vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
                *)((long)&(__range2->
                          super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
                          )._M_impl.super__Vector_impl_data._M_start + sVar3);
    InstructionNode::commitSize(*ppIVar4);
    __gnu_cxx::
    __normal_iterator<Lodtalk::MethodAssembler::InstructionNode_**,_std::vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>_>
    ::operator++(&__end2);
  }
  __range3 = __range2;
  do {
    pvVar1 = __range3;
    __range3 = (vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
                *)0x0;
    __end3 = std::
             vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
             ::begin(&this->instructionStream);
    instr_1 = (InstructionNode **)
              std::
              vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
              ::end(&this->instructionStream);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<Lodtalk::MethodAssembler::InstructionNode_**,_std::vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>_>
                                  *)&instr_1);
      if (!bVar2) break;
      ppIVar4 = __gnu_cxx::
                __normal_iterator<Lodtalk::MethodAssembler::InstructionNode_**,_std::vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>_>
                ::operator*(&__end3);
      sVar3 = InstructionNode::computeBetterSizeForPosition(*ppIVar4,(size_t)__range3);
      __range3 = (vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
                  *)((long)&(__range3->
                            super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
                            )._M_impl.super__Vector_impl_data._M_start + sVar3);
      __gnu_cxx::
      __normal_iterator<Lodtalk::MethodAssembler::InstructionNode_**,_std::vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>_>
      ::operator++(&__end3);
    }
    __end3_1 = std::
               vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
               ::begin(&this->instructionStream);
    instr_2 = (InstructionNode **)
              std::
              vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
              ::end(&this->instructionStream);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end3_1,
                         (__normal_iterator<Lodtalk::MethodAssembler::InstructionNode_**,_std::vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>_>
                          *)&instr_2);
      if (!bVar2) break;
      ppIVar4 = __gnu_cxx::
                __normal_iterator<Lodtalk::MethodAssembler::InstructionNode_**,_std::vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>_>
                ::operator*(&__end3_1);
      InstructionNode::commitSize(*ppIVar4);
      __gnu_cxx::
      __normal_iterator<Lodtalk::MethodAssembler::InstructionNode_**,_std::vector<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>_>
      ::operator++(&__end3_1);
    }
  } while (__range3 < pvVar1);
  return (size_t)__range3;
}

Assistant:

size_t Assembler::computeInstructionsSize()
{
	// Compute the max size.
	size_t maxSize = 0;
	for(auto &instr : instructionStream)
    {
		maxSize += instr->computeMaxSizeForPosition(maxSize);
        instr->commitSize();
    }

	// Compute the optimal iteratively.
	size_t oldSize = maxSize;
	size_t currentSize = maxSize;
	do
	{
		oldSize = currentSize;
		currentSize = 0;
		for(auto &instr : instructionStream)
			currentSize += instr->computeBetterSizeForPosition(currentSize);
        for(auto &instr : instructionStream)
            instr->commitSize();
	} while(currentSize < oldSize);

	return currentSize;
}